

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O1

iterator __thiscall
cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl
          (cmLinkedTree<cmStateDetail::PolicyStackEntry> *this,iterator it,PolicyStackEntry *t)

{
  pointer *ppPVar1;
  iterator __position;
  iterator __position_00;
  _WordT _Var2;
  _WordT _Var3;
  _WordT _Var4;
  _WordT _Var5;
  bool bVar6;
  undefined7 uVar7;
  ulong uVar8;
  iterator iVar9;
  ulong local_18;
  
  local_18 = it.Position;
  __position._M_current =
       (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_finish;
  uVar8 = (long)__position._M_current -
          (long)(this->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (uVar8 != ((long)(this->Data).
                      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->Data).
                      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555) {
    __assert_fail("this->UpPositions.size() == this->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                  ,0xb5,
                  "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T &&) [T = cmStateDetail::PolicyStackEntry]"
                 );
  }
  if (local_18 <= uVar8) {
    if (__position._M_current ==
        (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->UpPositions,
                 __position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      (this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    __position_00._M_current =
         (this->Data).
         super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->Data).
        super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
      ::_M_realloc_insert<cmStateDetail::PolicyStackEntry>(&this->Data,__position_00,t);
    }
    else {
      _Var2 = (t->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w[0];
      _Var3 = (t->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w[1];
      _Var4 = (t->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w[2];
      _Var5 = (t->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w[3];
      bVar6 = t->Weak;
      uVar7 = *(undefined7 *)&t->field_0x29;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w[4] =
           (t->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w[4];
      (__position_00._M_current)->Weak = bVar6;
      *(undefined7 *)&(__position_00._M_current)->field_0x29 = uVar7;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w[2] = _Var4;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w[3] = _Var5;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w[0] = _Var2;
      ((__position_00._M_current)->super_PolicyMap).Status.super__Base_bitset<5UL>._M_w[1] = _Var3;
      ppPVar1 = &(this->Data).
                 super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppPVar1 = *ppPVar1 + 1;
    }
    iVar9.Position =
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    iVar9.Tree = this;
    return iVar9;
  }
  __assert_fail("it.Position <= this->UpPositions.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmLinkedTree.h"
                ,0xb6,
                "iterator cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl(iterator, T &&) [T = cmStateDetail::PolicyStackEntry]"
               );
}

Assistant:

iterator Push_impl(iterator it, T&& t)
  {
    assert(this->UpPositions.size() == this->Data.size());
    assert(it.Position <= this->UpPositions.size());
    this->UpPositions.push_back(it.Position);
    this->Data.push_back(std::move(t));
    return iterator(this, this->UpPositions.size());
  }